

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O2

XXH64_hash_t XXH3_mergeAccs(xxh_u64 *acc,xxh_u8 *secret,xxh_u64 start)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  xxh_u64 result64;
  long lVar4;
  
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 0x10) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(secret + lVar4 + 8) ^ *(ulong *)((long)acc + lVar4 + 8);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)(secret + lVar4) ^ *(ulong *)((long)acc + lVar4);
    start = start + (SUB168(auVar1 * auVar2,8) ^ SUB168(auVar1 * auVar2,0));
  }
  uVar3 = (start >> 0x25 ^ start) * 0x165667919e3779f9;
  return uVar3 >> 0x20 ^ uVar3;
}

Assistant:

static XXH64_hash_t
XXH3_mergeAccs(const xxh_u64* XXH_RESTRICT acc, const xxh_u8* XXH_RESTRICT secret, xxh_u64 start)
{
    xxh_u64 result64 = start;
    size_t i = 0;

    for (i = 0; i < 4; i++) {
        result64 += XXH3_mix2Accs(acc+2*i, secret + 16*i);
#if defined(__clang__)                                /* Clang */ \
    && (defined(__arm__) || defined(__thumb__))       /* ARMv7 */ \
    && (defined(__ARM_NEON) || defined(__ARM_NEON__)) /* NEON */  \
    && !defined(XXH_ENABLE_AUTOVECTORIZE)             /* Define to disable */
        /*
         * UGLY HACK:
         * Prevent autovectorization on Clang ARMv7-a. Exact same problem as
         * the one in XXH3_len_129to240_64b. Speeds up shorter keys > 240b.
         * XXH3_64bits, len == 256, Snapdragon 835:
         *   without hack: 2063.7 MB/s
         *   with hack:    2560.7 MB/s
         */
        XXH_COMPILER_GUARD(result64);
#endif
    }

    return XXH3_avalanche(result64);
}